

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O3

Int __thiscall ipx::BasicLu::_Update(BasicLu *this,double pivot)

{
  lu_int lVar1;
  Int IVar2;
  ostream *poVar3;
  pointer pdVar4;
  logic_error *this_00;
  double *xstore;
  fmtflags floatfield;
  lu_int *Ui;
  char local_49;
  double local_48;
  double local_40;
  string local_38;
  
  xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = xstore[0x5d];
  local_48 = pivot;
  while( true ) {
    Ui = (this->Ui_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    lVar1 = basiclu_update((this->istore_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,xstore,
                           (this->Li_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->Lx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,Ui,
                           (this->Ux_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->Wi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->Wx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,local_48);
    floatfield = (fmtflags)Ui;
    if (lVar1 != 1) break;
    Reallocate(this);
    xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (lVar1 == -6) {
    IVar2 = -1;
  }
  else {
    if (lVar1 != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"basiclu_update failed");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pdVar4 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48 = pdVar4[0x5d];
    if ((10000000000.0 < local_48) && (local_40 < local_48)) {
      poVar3 = Control::Debug(this->control_,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," max eta = ",0xb);
      Format_abi_cxx11_(&local_38,(ipx *)0x0,local_48,2,0x100,floatfield);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_38._M_dataplus._M_p,local_38._M_string_length);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      pdVar4 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_48 = pdVar4[0x78];
    IVar2 = 0;
    if (1e-08 < local_48) {
      poVar3 = Control::Debug(this->control_,3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," relative error in new diagonal entry of U = ",0x2d);
      Format_abi_cxx11_(&local_38,(ipx *)0x0,local_48,2,0x100,floatfield);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_38._M_dataplus._M_p,local_38._M_string_length);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      IVar2 = 1;
    }
  }
  return IVar2;
}

Assistant:

Int BasicLu::_Update(double pivot) {
    double max_eta_old = xstore_[BASICLU_MAX_ETA];
    Int status;
    for (;;) {
        status = basiclu_update(istore_.data(), xstore_.data(),
                                Li_.data(), Lx_.data(),
                                Ui_.data(), Ux_.data(),
                                Wi_.data(), Wx_.data(), pivot);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status !=  BASICLU_ERROR_singular_update)
        throw std::logic_error("basiclu_update failed");
    if (status == BASICLU_ERROR_singular_update)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = xstore_[BASICLU_MAX_ETA];
    if (max_eta > 1e10 && max_eta > max_eta_old)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    double pivot_error = xstore_[BASICLU_PIVOT_ERROR];
    if (pivot_error > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(pivot_error) << '\n';
        return 1;
    }
    return 0;
}